

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void lts2::HardThresholding(Mat *src,Mat *thresholdedCoeffs,float threshold)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  
  cv::Mat::copyTo((_OutputArray *)src);
  uVar5 = 1;
  uVar4 = *(uint *)(thresholdedCoeffs + 8);
  if (((byte)thresholdedCoeffs[1] & 0x40) == 0) {
    uVar4 = 1;
    uVar5 = *(uint *)(thresholdedCoeffs + 8);
  }
  if (0 < (int)uVar5) {
    iVar1 = *(int *)(thresholdedCoeffs + 0xc);
    lVar2 = *(long *)(thresholdedCoeffs + 0x10);
    lVar3 = **(long **)(thresholdedCoeffs + 0x48);
    uVar6 = 0;
    do {
      if (0 < (int)(uVar4 * iVar1)) {
        fVar8 = *(float *)(lVar2 + lVar3 * uVar6);
        iVar7 = uVar4 * iVar1;
        do {
          fVar8 = (float)(-(uint)(threshold < ABS(fVar8)) & 0x3f800000) * fVar8;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        *(float *)(lVar2 + lVar3 * uVar6) = fVar8;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

void lts2::HardThresholding(const cv::Mat &src, cv::Mat &thresholdedCoeffs, float threshold)
{
  src.copyTo(thresholdedCoeffs);
    
  int rows = thresholdedCoeffs.rows;
  int cols = thresholdedCoeffs.cols;
    
  if (thresholdedCoeffs.isContinuous())
  {
    cols *= rows;
    rows = 1;
  }
    
  for (int y = 0; y < rows; ++y)
  {
    float *p_coeffs = thresholdedCoeffs.ptr<float>(y);
    for (int x = 0; x < cols; ++x) 
      *p_coeffs *= (std::fabs(*p_coeffs) - threshold > 0.0f ? 1.0f: 0.0f);
  }
}